

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O2

ConcatStringMulti *
Js::ConcatStringMulti::New
          (uint slotCount,JavascriptString *a1,JavascriptString *a2,ScriptContext *scriptContext)

{
  Recycler *alloc;
  ConcatStringMulti *this;
  StaticType *stringTypeStatic;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  data.typeinfo = (type_info *)((ulong)slotCount << 3);
  local_58 = (undefined1  [8])&typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_5ff2f34;
  data.filename._0_4_ = 0x213;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
  this = (ConcatStringMulti *)new<Memory::Recycler>(0x30,alloc,0x37ff80,0);
  stringTypeStatic =
       StringCache::GetStringTypeStatic
                 (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
  ConcatStringMulti(this,slotCount,a1,a2,stringTypeStatic);
  return this;
}

Assistant:

ConcatStringMulti*
    ConcatStringMulti::New(uint slotCount, JavascriptString * a1, JavascriptString * a2, ScriptContext * scriptContext)
    {
        return RecyclerNewPlus(scriptContext->GetRecycler(),
            sizeof(JavascriptString *) * slotCount, ConcatStringMulti, slotCount, a1, a2,
            scriptContext->GetLibrary()->GetStringTypeStatic());
    }